

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O1

void __thiscall
CVmObjCharSet::restore_from_file
          (CVmObjCharSet *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_3)

{
  uint uVar1;
  long lVar2;
  ulong buflen;
  char buf [128];
  ushort local_a8 [68];
  
  CVmFile::read_bytes(fp,(char *)local_a8,2);
  uVar1 = 0x80;
  if (local_a8[0] < 0x80) {
    uVar1 = (uint)local_a8[0];
  }
  buflen = (ulong)uVar1;
  CVmFile::read_bytes(fp,(char *)local_a8,buflen);
  if (0x80 < (ulong)local_a8[0]) {
    lVar2 = ftell((FILE *)fp->fp_);
    fseek((FILE *)fp->fp_,(local_a8[0] - buflen) + lVar2,0);
  }
  alloc_ext(this,(char *)local_a8,buflen);
  return;
}

Assistant:

void CVmObjCharSet::restore_from_file(VMG_ vm_obj_id_t self,
                                      CVmFile *fp, CVmObjFixup *)
{
    char buf[128];
    size_t len;
    size_t read_len;

    /* read the length of the character set name */
    len = fp->read_uint2();

    /* limit the reading to the length of the buffer */
    read_len = len;
    if (read_len > sizeof(buf))
        read_len = sizeof(buf);

    /* read the name, up to the buffer length */
    fp->read_bytes(buf, read_len);

    /* skip any bytes we couldn't fit in the buffer */
    if (len > read_len)
        fp->set_pos(fp->get_pos() + len - read_len);

    /* initialize from the saved data */
    alloc_ext(vmg_ buf, read_len);
}